

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,
          TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *gel)

{
  int64_t iVar1;
  long lVar2;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018d2310;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018d17f0,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018d14f0;
  (this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018d1c50;
  iVar1 = (gel->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes
          [1];
  (this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0] =
       (gel->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0]
  ;
  (this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[1] =
       iVar1;
  (this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2] =
       (gel->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2]
  ;
  (this->fGeo).super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTriangleSphere_018d1380;
  TPZVec<double>::TPZVec(&(this->fGeo).fXc,&(gel->fGeo).fXc);
  (this->fGeo).fR = (gel->fGeo).fR;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  lVar2 = 0;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)&gel->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}